

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

void http_parser_init_(http_parser *parser,http_parser_type t)

{
  uchar uVar1;
  
  *(undefined8 *)parser = 0;
  parser->content_length = 0;
  parser->http_major = 0;
  parser->http_minor = 0;
  parser->status_code = 0;
  parser->method = '\0';
  parser->field_0x17 = 0;
  *(byte *)parser = (byte)t & 3;
  uVar1 = '\x11';
  if (t != HTTP_REQUEST) {
    uVar1 = (t == HTTP_RESPONSE) * '\x02' + '\x02';
  }
  parser->state = uVar1;
  return;
}

Assistant:

void
http_parser_init_ (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}